

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O3

void __thiscall ExtendedMatrix::ExtendedMatrix(ExtendedMatrix *this,Matrix *main,Matrix *extension)

{
  pointer pvVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = main->m_;
  (this->main_).n_ = main->n_;
  (this->main_).m_ = iVar2;
  pvVar1 = (main->elements_).
           super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->main_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (main->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->main_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  (this->main_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (main->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (main->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (main->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (main->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = extension->m_;
  (this->extension_).n_ = extension->n_;
  (this->extension_).m_ = iVar2;
  pvVar1 = (extension->elements_).
           super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->extension_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (extension->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->extension_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  (this->extension_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (extension->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (extension->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (extension->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (extension->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = Matrix::GetNumRows(main);
  Permutation::Permutation(&this->row_permutation_,iVar2);
  iVar2 = Matrix::GetNumColumns(main);
  Permutation::Permutation(&this->main_column_permutation_,iVar2);
  iVar2 = Matrix::GetNumColumns(extension);
  Permutation::Permutation(&this->extension_column_permutation_,iVar2);
  iVar2 = Matrix::GetNumRows(&this->main_);
  iVar3 = Matrix::GetNumRows(&this->extension_);
  if (iVar2 == iVar3) {
    return;
  }
  __assert_fail("main_.GetNumRows() == extension_.GetNumRows()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/extended_matrix.cpp"
                ,9,"ExtendedMatrix::ExtendedMatrix(Matrix, Matrix)");
}

Assistant:

ExtendedMatrix::ExtendedMatrix(Matrix main, Matrix extension)
  : main_(std::move(main)),
    extension_(std::move(extension)),
    row_permutation_(main.GetNumRows()),
    main_column_permutation_(main.GetNumColumns()),
    extension_column_permutation_(extension.GetNumColumns()){
  assert(main_.GetNumRows() == extension_.GetNumRows());
}